

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfFunction.h
# Opt level: O1

void __thiscall
halfFunction<half>::halfFunction<half(*)(half)>
          (halfFunction<half> *this,_func_half_half *f,half domainMin,half domainMax,
          half defaultValue,half posInfValue,half negInfValue,half nanValue)

{
  float *pfVar1;
  float fVar2;
  half hVar3;
  half *phVar4;
  int i;
  ulong uVar5;
  
  phVar4 = (half *)operator_new__(0x20000);
  this->_lut = phVar4;
  uVar5 = 0;
  do {
    if ((uVar5 & 0x3ff) == 0 || (~(uint)uVar5 & 0x7c00) != 0) {
      if (((uint)uVar5 & 0x7fff) == 0x7c00) {
        phVar4 = this->_lut;
        hVar3._h = posInfValue._h;
        if ((short)(unsigned_short)uVar5 < 0) {
          hVar3._h = negInfValue._h;
        }
      }
      else {
        fVar2 = *(float *)((long)&half::_toFloat + uVar5 * 4);
        if ((*(float *)((long)&half::_toFloat + (ulong)domainMin._h * 4) <= fVar2) &&
           (pfVar1 = (float *)((long)&half::_toFloat + (ulong)domainMax._h * 4),
           fVar2 < *pfVar1 || fVar2 == *pfVar1)) {
          hVar3 = (*f)((unsigned_short)uVar5);
          this->_lut[uVar5]._h = hVar3._h;
          goto LAB_00164fbe;
        }
        phVar4 = this->_lut;
        hVar3._h = defaultValue._h;
      }
      phVar4[uVar5]._h = hVar3._h;
    }
    else {
      this->_lut[uVar5]._h = nanValue._h;
    }
LAB_00164fbe:
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x10000) {
      return;
    }
  } while( true );
}

Assistant:

halfFunction<T>::halfFunction (Function f,
			       half domainMin,
			       half domainMax,
			       T defaultValue,
			       T posInfValue,
			       T negInfValue,
			       T nanValue)
{
#ifndef ILMBASE_HAVE_LARGE_STACK
    _lut = new T[1<<16];
#endif
    
    for (int i = 0; i < (1 << 16); i++)
    {
	half x;
	x.setBits (i);

	if (x.isNan())
	    _lut[i] = nanValue;
	else if (x.isInfinity())
	    _lut[i] = x.isNegative()? negInfValue: posInfValue;
	else if (x < domainMin || x > domainMax)
	    _lut[i] = defaultValue;
	else
	    _lut[i] = f (x);
    }
}